

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O3

size_t __thiscall merlin::factor::sample(factor *this)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  double *pdVar4;
  size_t sVar5;
  size_t sVar6;
  double dVar7;
  double dVar8;
  
  iVar3 = rand();
  pdVar1 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 == pdVar2) {
    sVar5 = (long)pdVar2 - (long)pdVar1 >> 3;
  }
  else {
    dVar7 = 0.0;
    pdVar4 = pdVar1;
    do {
      dVar7 = dVar7 + *pdVar4;
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
    sVar5 = (long)pdVar2 - (long)pdVar1 >> 3;
    if (pdVar2 != pdVar1) {
      dVar8 = 0.0;
      sVar6 = 0;
      do {
        dVar8 = dVar8 + pdVar1[sVar6];
        if (((double)iVar3 / 2147483647.0) * dVar7 < dVar8) {
          return sVar6;
        }
        sVar6 = sVar6 + 1;
      } while (sVar5 + (sVar5 == 0) != sVar6);
    }
  }
  return sVar5;
}

Assistant:

size_t sample() const {
		double x = 0.0, y = randu() * sum();
		for (size_t i = 0; i < num_states(); ++i)
			if ((x += t_[i]) > y)
				return i;
		return num_states();
	}